

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O2

string<unsigned_long> * __thiscall
irr::core::string<unsigned_long>::operator=(string<unsigned_long> *this,unsigned_long *c)

{
  uint uVar1;
  unsigned_long *puVar2;
  long lVar3;
  unsigned_long *puVar4;
  long lVar5;
  bool bVar6;
  
  puVar4 = this->array;
  if (c == (unsigned_long *)0x0) {
    if (puVar4 == (unsigned_long *)0x0) {
      puVar4 = (unsigned_long *)operator_new__(8);
      this->array = puVar4;
      this->allocated = 1;
      this->used = 1;
    }
    *puVar4 = 0;
  }
  else if (puVar4 != c) {
    uVar1 = 0;
    lVar5 = 1;
    for (puVar2 = c; uVar1 = uVar1 + 1, *puVar2 != 0; puVar2 = puVar2 + 1) {
      lVar5 = lVar5 + 1;
    }
    this->used = uVar1;
    this->allocated = uVar1;
    puVar2 = (unsigned_long *)operator_new__((ulong)uVar1 << 3);
    this->array = puVar2;
    lVar3 = 0;
    while (bVar6 = lVar5 != 0, lVar5 = lVar5 + -1, bVar6) {
      *(undefined8 *)((long)this->array + lVar3) = *(undefined8 *)((long)c + lVar3);
      lVar3 = lVar3 + 8;
    }
    if (puVar4 != (unsigned_long *)0x0) {
      operator_delete__(puVar4);
    }
  }
  return this;
}

Assistant:

string<T>& operator=(const B* c) 
	{
		if (!c)
		{
			if (!array)
			{
				array = new T[1];
				allocated = 1;
				used = 1;
			}
			array[0] = 0x0;
			return *this;
		}

		if ((void*)c == (void*)array)
			return *this;

		s32 len = 0;
		const B* p = c;
		while(*p)
		{
			++len;
			++p;
		}

		// we'll take the old string for a while, because the new string could be
		// a part of the current string.
		T* oldArray = array;

        allocated = used = len+1;
		array = new T[used];

		for (s32 l = 0; l<len+1; ++l)
			array[l] = (T)c[l];

		delete [] oldArray;
		return *this;
	}